

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
not_null_function::evaluate
          (not_null_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *param_3)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  reference pbVar5;
  reference unaff_R14;
  parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *param;
  pointer ppVar6;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar6 = (args->
                super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; bVar3 = ppVar6 != ppVar1, bVar3;
      ppVar6 = ppVar6 + 1) {
    bVar2 = true;
    if ((ppVar6->type_ == value) &&
       (bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                          ((ppVar6->field_1).value_), !bVar4)) {
      unaff_R14 = (reference)(ppVar6->field_1).expression_;
      bVar2 = false;
    }
    if (!bVar2) break;
  }
  if (bVar3) {
    return unaff_R14;
  }
  pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar5;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code&) const override
            {
                for (auto& param : args)
                {
                    if (param.is_value() && !param.value().is_null())
                    {
                        return param.value();
                    }
                }
                return context.null_value();
            }